

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O1

void Interactive(HSQUIRRELVM v)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SQChar *pSVar4;
  SQChar *__s;
  size_t sVar5;
  SQRESULT SVar6;
  long lVar7;
  long lVar8;
  SQInteger done;
  HSQOBJECT bindingsTable;
  SQChar buffer [1024];
  SQBool local_460;
  long local_458;
  SQInteger local_450;
  HSQOBJECT local_448;
  char local_438 [1032];
  
  local_458 = 0;
  fprintf(_stdout,"%s %s (%d bits)\n","4.8.0",
          "Copyright (C) 2003-2016 Alberto Demichelis; 2016-2024 Gaijin Games KFT",0x40);
  sq_newtable(v);
  sq_getstackobj(v,-1,&local_448);
  sq_addref(v,&local_448);
  sq_registerbaselib(v);
  sq_pushstring(v,"quit",-1);
  sq_pushuserpointer(v,&local_458);
  sq_newclosure(v,quit,1);
  sq_setparamscheck(v,1,(SQChar *)0x0);
  sq_newslot(v,-3,0);
  sq_pop(v,1);
  local_460 = 0;
  bVar1 = false;
  lVar7 = 0;
  do {
    if (local_458 != 0) {
      sq_release(v,&local_448);
      return;
    }
    printf("\nsq>");
    lVar8 = 0;
    do {
      if (local_458 == 0) {
        iVar3 = getchar();
        if (iVar3 == 0x7d) {
          lVar7 = lVar7 + -1;
          iVar3 = 0x7d;
        }
        else if (iVar3 == 10) {
          if ((lVar8 < 1) || (local_438[lVar8 + -1] != '\\')) {
            iVar3 = 10;
            if (lVar7 == 0) {
              iVar3 = 4;
              bVar2 = false;
              lVar7 = 0;
              goto LAB_001150b2;
            }
          }
          else {
            local_438[lVar8 + -1] = '\n';
            iVar3 = 10;
          }
        }
        else if ((iVar3 != 0x7b) || (bVar1)) {
          if ((iVar3 == 0x27) || (iVar3 == 0x22)) {
            bVar1 = !bVar1;
          }
          else if (0x3fe < lVar8) {
            Interactive();
            iVar3 = 4;
            goto LAB_00115024;
          }
        }
        else {
          lVar7 = lVar7 + 1;
          iVar3 = 0x7b;
          bVar1 = false;
        }
        local_438[lVar8] = (char)iVar3;
        lVar8 = lVar8 + 1;
        iVar3 = 0;
        bVar2 = true;
      }
      else {
        iVar3 = 1;
LAB_00115024:
        bVar2 = false;
      }
LAB_001150b2:
    } while (iVar3 == 0);
    if (iVar3 == 4) {
      local_438[lVar8] = '\0';
      if (local_438[0] == '=') {
        pSVar4 = sq_getscratchpad(v,0x400);
        snprintf(pSVar4,0x400,"return (%s)",local_438 + 1);
        pSVar4 = sq_getscratchpad(v,-1);
        __s = sq_getscratchpad(v,-1);
        sVar5 = strlen(__s);
        memcpy(local_438,pSVar4,sVar5 + 1);
        local_460 = 1;
      }
      sVar5 = strlen(local_438);
      bVar2 = true;
      if (0 < (long)sVar5) {
        local_450 = sq_gettop(v);
        SVar6 = sq_compile(v,local_438,sVar5,"interactive console",1,&local_448);
        if (-1 < SVar6) {
          sq_pushroottable(v);
          SVar6 = sq_call(v,1,local_460,1);
          if (local_460 != 0 && -1 < SVar6) {
            putchar(10);
            sq_pushroottable(v);
            sq_pushstring(v,"print",-1);
            sq_get(v,-2);
            sq_pushroottable(v);
            sq_push(v,-4);
            sq_call(v,2,0,1);
            putchar(10);
            local_460 = 0;
          }
        }
        sq_settop(v,local_450);
      }
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    HSQOBJECT bindingsTable;
    sq_newtable(v);
    sq_getstackobj(v, -1, &bindingsTable);
    sq_addref(v, &bindingsTable);

    sq_registerbaselib(v);

    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);

    sq_pop(v, 1); // bindingsTable

    while (!done)
    {
        SQInteger i = 0;
        printf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
            c = getchar();
            if (c == _SC('\n')) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
                fprintf(stderr, _SC("sq : input line too long\n"));
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(strlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=strlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compile(v,buffer,i,_SC("interactive console"),SQTrue,&bindingsTable))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    printf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    printf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }

    sq_release(v, &bindingsTable);
}